

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::UnsetEnv(char *value)

{
  unsetenv(value);
  return true;
}

Assistant:

bool cmSystemTools::UnsetEnv(const char* value)
{
#  if !defined(HAVE_UNSETENV)
  return cmSystemTools::UnPutEnv(value);
#  else
  unsetenv(value);
  return true;
#  endif
}